

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

string * __thiscall
Config::get_property_abi_cxx11_(string *__return_storage_ptr__,Config *this,string_view key)

{
  bool bVar1;
  const_pointer pvVar2;
  mapped_type *pmVar3;
  allocator<char> local_94;
  byte local_93;
  byte local_92;
  allocator<char> local_91;
  key_type local_90;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_70 [3];
  allocator<char> local_51;
  key_type local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_30;
  Config *local_28;
  Config *this_local;
  string_view key_local;
  
  key_local._M_len = (size_t)key._M_str;
  this_local = (Config *)key._M_len;
  local_28 = this;
  key_local._M_str = (char *)__return_storage_ptr__;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::allocator<char>::allocator();
  local_92 = 0;
  local_93 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pvVar2,&local_51);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->config,&local_50);
  local_70[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->config);
  bVar1 = std::__detail::operator!=(&local_30,local_70);
  if (bVar1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::allocator<char>::allocator();
    local_92 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pvVar2,&local_91);
    local_93 = 1;
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->config,&local_90);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar3);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_94);
    std::allocator<char>::~allocator(&local_94);
  }
  if ((local_93 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((local_92 & 1) != 0) {
    std::allocator<char>::~allocator(&local_91);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return __return_storage_ptr__;
}

Assistant:

std::string Config::get_property(const std::string_view key) {
  return (config.find(key.data()) != config.end()) ? config[key.data()] : "";
}